

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack8_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xff;
  out[1] = *in >> 8 & 0xff;
  out[2] = *in >> 0x10 & 0xff;
  out[3] = *in >> 0x18;
  puVar1 = in + 1;
  out[4] = *puVar1 & 0xff;
  out[5] = *puVar1 >> 8 & 0xff;
  out[6] = *puVar1 >> 0x10 & 0xff;
  out[7] = *puVar1 >> 0x18;
  puVar1 = in + 2;
  out[8] = *puVar1 & 0xff;
  out[9] = *puVar1 >> 8 & 0xff;
  out[10] = *puVar1 >> 0x10 & 0xff;
  out[0xb] = *puVar1 >> 0x18;
  puVar1 = in + 3;
  out[0xc] = *puVar1 & 0xff;
  out[0xd] = *puVar1 >> 8 & 0xff;
  out[0xe] = *puVar1 >> 0x10 & 0xff;
  out[0xf] = *puVar1 >> 0x18;
  puVar1 = in + 4;
  out[0x10] = *puVar1 & 0xff;
  out[0x11] = *puVar1 >> 8 & 0xff;
  out[0x12] = *puVar1 >> 0x10 & 0xff;
  out[0x13] = *puVar1 >> 0x18;
  puVar1 = in + 5;
  out[0x14] = *puVar1 & 0xff;
  out[0x15] = *puVar1 >> 8 & 0xff;
  out[0x16] = *puVar1 >> 0x10 & 0xff;
  out[0x17] = *puVar1 >> 0x18;
  puVar1 = in + 6;
  out[0x18] = *puVar1 & 0xff;
  out[0x19] = *puVar1 >> 8 & 0xff;
  out[0x1a] = *puVar1 >> 0x10 & 0xff;
  out[0x1b] = *puVar1 >> 0x18;
  puVar1 = in + 7;
  out[0x1c] = *puVar1 & 0xff;
  out[0x1d] = *puVar1 >> 8 & 0xff;
  out[0x1e] = *puVar1 >> 0x10 & 0xff;
  out[0x1f] = *puVar1 >> 0x18;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack8_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}